

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamEuler::ShapeFunctions(ChElementBeamEuler *this,ShapeVector *N,double eta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  auVar7._8_56_ = in_register_00001208;
  auVar7._0_8_ = eta;
  auVar8._8_8_ = eta;
  auVar8._0_8_ = eta;
  dVar3 = 1.0 - eta;
  dVar2 = eta + 1.0;
  dVar1 = (this->super_ChElementBeam).length;
  dVar9 = 1.0 / (dVar1 + dVar1);
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = eta * 3.0;
  auVar6 = vxorpd_avx512vl(auVar14,auVar4);
  auVar14 = vfmadd231sd_fma(ZEXT816(0xc008000000000000),auVar14,auVar7._0_16_);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = eta * 3.0;
  auVar5 = vfnmadd213sd_fma(auVar7._0_16_,auVar15,ZEXT816(0x4008000000000000));
  auVar12._8_8_ = 0x3fe0000000000000;
  auVar12._0_8_ = 0x3fe0000000000000;
  auVar10._8_8_ = 0xc000000000000000;
  auVar10._0_8_ = 0xc000000000000000;
  auVar10 = vfmadd213pd_fma(auVar10,auVar8,_DAT_0096a920);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar3 * dVar3 * 0.25;
  auVar4 = vunpcklpd_avx(auVar12,auVar13);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[0] =
       dVar3 * auVar4._0_8_;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[1] =
       (eta + 2.0) * auVar4._8_8_;
  auVar11._8_8_ = 0x3fd0000000000000;
  auVar11._0_8_ = 0x3fd0000000000000;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[2] =
       dVar2 * dVar1 * 0.125 * dVar3 * dVar3;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[3] =
       dVar2 * 0.5;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1 * 0.125;
  auVar4 = vunpcklpd_avx(auVar11,auVar16);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[4] =
       (2.0 - eta) * dVar2 * dVar2 * auVar4._0_8_;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[5] =
       (eta + -1.0) * dVar2 * dVar2 * auVar4._8_8_;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[6] =
       auVar14._0_8_ * dVar9;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[7] =
       auVar5._0_8_ * dVar9;
  auVar4 = vunpcklpd_avx(auVar15,auVar6);
  auVar4 = vfmadd213pd_fma(auVar4,auVar8,auVar10);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[8] =
       auVar4._0_8_ * 0.25;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[9] =
       auVar4._8_8_ * -0.25;
  return;
}

Assistant:

void ChElementBeamEuler::ShapeFunctions(ShapeVector& N, double eta) {
    double Nx1 = (1. / 2.) * (1 - eta);
    double Nx2 = (1. / 2.) * (1 + eta);
    double Ny1 = (1. / 4.) * pow((1 - eta), 2) * (2 + eta);
    double Ny2 = (1. / 4.) * pow((1 + eta), 2) * (2 - eta);
    double Nr1 = (this->length / 8.) * pow((1 - eta), 2) * (1 + eta);
    double Nr2 = (this->length / 8.) * pow((1 + eta), 2) * (eta - 1);
    /*
    N(0) = Nx1;
    N(1) = Ny1;
    N(2) = Ny1;
    N(3) = Nx1;
    N(4) = -Nr1;
    N(5) = Nr1;
    N(6) = Nx2;
    N(7) = Ny2;
    N(8) = Ny2;
    N(9) = Nx2;
    N(10) = -Nr2;
    N(11) = Nr2;
    */
    double dN_ua = (1. / (2. * this->length)) * (-3. + 3 * eta * eta);
    double dN_ub = (1. / (2. * this->length)) * (3. - 3 * eta * eta);
    double dN_ra = (1. / 4.) * (-1. - 2 * eta + 3 * eta * eta);
    double dN_rb = -(1. / 4.) * (1. - 2 * eta - 3 * eta * eta);
    N(0) = Nx1;
    N(1) = Ny1;
    N(2) = Nr1;
    N(3) = Nx2;
    N(4) = Ny2;
    N(5) = Nr2;
    N(6) = dN_ua;
    N(7) = dN_ub;
    N(8) = dN_ra;
    N(9) = dN_rb;
}